

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vlbb(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int iVar1;
  int iVar2;
  uint uVar3;
  TCGv_i64 ret;
  TCGv_ptr ret_00;
  uintptr_t o_1;
  DisasJumpType DVar4;
  uintptr_t o_2;
  
  tcg_ctx = s->uc->tcg_ctx;
  DVar4 = DISAS_NORETURN;
  iVar1 = get_field1(s,FLD_O_m3,FLD_C_i3);
  iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
  uVar3 = vec_full_reg_offset((uint8_t)iVar2);
  iVar2 = get_field1(s,FLD_O_m3,FLD_C_i3);
  if (iVar2 < 7) {
    ret = tcg_temp_new_i64(tcg_ctx);
    ret_00 = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_ori_i64_s390x(tcg_ctx,ret,o->addr1,-1L << ((char)iVar1 + 6U & 0x3f));
    tcg_gen_neg_i64(tcg_ctx,ret,ret);
    tcg_gen_addi_i64_s390x(tcg_ctx,(TCGv_i64)ret_00,(TCGv_i64)tcg_ctx->cpu_env,(ulong)uVar3);
    gen_helper_vll(tcg_ctx,tcg_ctx->cpu_env,ret_00,o->addr1,ret);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    DVar4 = DISAS_NEXT;
  }
  else {
    gen_program_exception(s,6);
  }
  return DVar4;
}

Assistant:

static DisasJumpType op_vlbb(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const int64_t block_size = (1ull << (get_field(s, m3) + 6));
    const int v1_offs = vec_full_reg_offset(get_field(s, v1));
    TCGv_ptr a0;
    TCGv_i64 bytes;

    if (get_field(s, m3) > 6) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    bytes = tcg_temp_new_i64(tcg_ctx);
    a0 = tcg_temp_new_ptr(tcg_ctx);
    /* calculate the number of bytes until the next block boundary */
    tcg_gen_ori_i64(tcg_ctx, bytes, o->addr1, -block_size);
    tcg_gen_neg_i64(tcg_ctx, bytes, bytes);

    tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, v1_offs);
    gen_helper_vll(tcg_ctx, tcg_ctx->cpu_env, a0, o->addr1, bytes);
    tcg_temp_free_i64(tcg_ctx, bytes);
    tcg_temp_free_ptr(tcg_ctx, a0);
    return DISAS_NEXT;
}